

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

char * ctemplate_htmlparser::entityfilter_process(entityfilter_ctx *ctx,char c)

{
  int iVar1;
  long lVar2;
  char *__nptr;
  undefined **ppuVar3;
  uint uVar4;
  
  if (ctx->in_entity == 0) {
    if (c == '&') {
      ctx->buffer_pos = 0;
      ctx->in_entity = 1;
      goto LAB_00132fb0;
    }
    ctx->output[0] = c;
  }
  else {
    uVar4 = (uint)c;
    if ((0x3b < uVar4) || ((0x800000100002600U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) {
      iVar1 = ctx->buffer_pos;
      ctx->buffer_pos = iVar1 + 1;
      ctx->buffer[iVar1] = c;
      if (7 < (long)ctx->buffer_pos) {
        ctx->buffer[ctx->buffer_pos] = '\0';
        ctx->buffer_pos = 0;
        ctx->in_entity = 0;
        snprintf(ctx->output,10,"&%s",ctx->buffer);
        ctx->output[9] = '\0';
        return ctx->output;
      }
LAB_00132fb0:
      return "";
    }
    ctx->in_entity = 0;
    ctx->buffer[ctx->buffer_pos] = '\0';
    ctx->buffer_pos = 0;
    if (ctx->buffer[0] != '#') {
      ppuVar3 = &PTR_anon_var_dwarf_78cff_00153c38;
      while( true ) {
        if (ppuVar3[-1] == (char *)0x0) {
          snprintf(ctx->output,10,"&%s%c",ctx->buffer,(ulong)uVar4);
          ctx->output[9] = '\0';
          return ctx->output;
        }
        iVar1 = strcasecmp(ppuVar3[-1],ctx->buffer);
        if (iVar1 == 0) break;
        ppuVar3 = ppuVar3 + 2;
      }
      return *ppuVar3;
    }
    if ((byte)(ctx->buffer[1] | 0x20U) == 0x78) {
      __nptr = ctx->buffer + 2;
      iVar1 = 0x10;
    }
    else {
      __nptr = ctx->buffer + 1;
      iVar1 = 10;
    }
    lVar2 = strtol(__nptr,(char **)0x0,iVar1);
    ctx->output[0] = (char)lVar2;
  }
  ctx->output[1] = '\0';
  return ctx->output;
}

Assistant:

const char *entityfilter_process(entityfilter_ctx *ctx, char c)
{
    if (ctx->in_entity) {
        if (c == ';' || html_isspace(c)) {
            ctx->in_entity = 0;
            ctx->buffer[ctx->buffer_pos] = '\0';
            ctx->buffer_pos = 0;
            return entity_convert(ctx->buffer, ctx->output, c);
        } else {
            ctx->buffer[ctx->buffer_pos++] = c;
            if (ctx->buffer_pos >= HTMLPARSER_MAX_ENTITY_SIZE - 2) {
                /* No more buffer to use, finalize and return.
                 * We need two characters left, one for the '&' character and
                 * another for the NULL termination. */
                ctx->buffer[ctx->buffer_pos] = '\0';
                ctx->in_entity=0;
                ctx->buffer_pos = 0;
                snprintf(ctx->output, HTMLPARSER_MAX_ENTITY_SIZE, "&%s",
                         ctx->buffer);
                ctx->output[HTMLPARSER_MAX_ENTITY_SIZE - 1] = '\0';
                return ctx->output;
            }
        }
    } else {
        if (c == '&') {
            ctx->in_entity = 1;
            ctx->buffer_pos = 0;
        } else {
            ctx->output[0] = c;
            ctx->output[1] = 0;
            return ctx->output;
        }
    }
    return "";
}